

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_oom.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1b6d1::
ARTOOMTest_Node48ShrinkToNode16_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTOOMTest_Node48ShrinkToNode16_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  bool bVar3;
  undefined **ppuVar4;
  pointer_____offset_0x10___ *ppuVar5;
  ulong k;
  value_view v;
  undefined1 local_180 [8];
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  AssertHelper local_60;
  undefined1 local_58 [32];
  unsigned_long local_38;
  
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                   *)local_180,false);
  k = 0x80;
  ppuVar4 = &PTR_typeinfo_name_001fd998;
  ppuVar5 = &(anonymous_namespace)::
             ARTOOMTest_Node16_Test<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
             ::typeinfo;
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = k;
    uVar2 = SUB168(auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x1ffffffffffffffc;
    v._M_extent._M_extent_value = (size_t)ppuVar4[uVar2 * -3];
    v._M_ptr = ppuVar5[uVar2 * -3];
    unodb::test::
    tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
    ::insert_internal((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                       *)local_180,k,v,false);
    k = k + 1;
    ppuVar4 = ppuVar4 + 2;
    ppuVar5 = ppuVar5 + 2;
  } while (k != 0x91);
  local_58._0_8_ = (pointer)0x11;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  local_58._24_8_ = 1;
  local_38 = 0;
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_node_counts
            ((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_180,(node_type_counter_array *)local_58);
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  local_58._24_8_ = 0;
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_shrinking_inodes
            ((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_180,(inode_type_counter_array *)local_58);
  unodb::test::allocation_failure_injector::fail_on_nth_allocation_.
  super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
  local_58._16_8_ = 0;
  local_58._24_8_ = 0;
  local_58._8_8_ = 0;
  local_58._0_8_ = local_58 + 0x10;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    unodb::test::
    tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
    ::do_remove((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)local_180,0x85,false);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,0,
             local_58._8_8_,
             "Expected: test(verifier) throws an exception of type std::bad_alloc.\n  Actual: it throws nothing."
             ,0x61);
  testing::Message::Message
            ((Message *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::AssertHelper::AssertHelper
            (&local_60,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_oom.cpp"
             ,0x30,(char *)local_58._0_8_);
  testing::internal::AssertHelper::operator=
            (&local_60,
             (Message *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  if (verifier.key_views.
      super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (**(code **)(*(long *)(verifier.key_views.
                           super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_elems + 8))();
  }
  if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if (verifier._224_8_ != 0) {
    operator_delete((void *)verifier._224_8_,
                    (long)verifier.key_views.
                          super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - verifier._224_8_);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
               *)&verifier.test_db.mutex.super___mutex_base._M_mutex.__data.__list.__next);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::~db
            ((db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)&verifier);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTOOMTest, Node48ShrinkToNode16) {
  oom_remove_test<TypeParam>(
      2,
      [](unodb::test::tree_verifier<TypeParam>& verifier) {
        verifier.insert_key_range(0x80, 17);
#ifdef UNODB_DETAIL_WITH_STATS
        verifier.assert_node_counts({17, 0, 0, 1, 0});
        verifier.assert_shrinking_inodes({0, 0, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS
      },
      0x85,
      [](unodb::test::tree_verifier<TypeParam>&
#ifdef UNODB_DETAIL_WITH_STATS
             verifier
#endif  // UNODB_DETAIL_WITH_STATS
      ) {
#ifdef UNODB_DETAIL_WITH_STATS
        verifier.assert_shrinking_inodes({0, 0, 1, 0});
        verifier.assert_node_counts({16, 0, 1, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS
      });
}